

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void idr_resolve(idr *idr,_func_void_uchar_ptr_int *fsetnum)

{
  int iVar1;
  long lVar2;
  int iVar3;
  uchar *p;
  idrent *n;
  _func_void_uchar_ptr_int *fsetnum_local;
  idr *idr_local;
  
  for (p = (uchar *)(idr->wait_list).first; p != (uchar *)0x0; p = *(uchar **)(p + 0x18)) {
    idr_extend_identifier((idrent *)p,idr->num_size,idr->null_size);
    lVar2 = *(long *)(*(long *)(p + 0x28) + 0xa8);
    iVar1 = *(int *)(p + 0x34);
    do {
      iVar3 = *(int *)(*(long *)(p + 0x20) + 0x38);
      *(int *)(*(long *)(p + 0x20) + 0x38) = iVar3 + 1;
      (*fsetnum)((uchar *)(lVar2 + iVar1),iVar3);
      iVar3 = __archive_rb_tree_insert_node(&idr->rbtree,(archive_rb_node *)p);
    } while (iVar3 == 0);
  }
  return;
}

Assistant:

static void
idr_resolve(struct idr *idr, void (*fsetnum)(unsigned char *p, int num))
{
	struct idrent *n;
	unsigned char *p;

	for (n = idr->wait_list.first; n != NULL; n = n->wnext) {
		idr_extend_identifier(n, idr->num_size, idr->null_size);
		p = (unsigned char *)n->isoent->identifier + n->noff;
		do {
			fsetnum(p, n->avail->rename_num++);
		} while (!__archive_rb_tree_insert_node(
		    &(idr->rbtree), &(n->rbnode)));
	}
}